

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

const_iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::find_as<unsigned_int>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,uint *Val)

{
  bool bVar1;
  pointer in_RAX;
  pointer pvVar2;
  const_iterator cVar3;
  pointer local_18;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket;
  
  local_18 = in_RAX;
  bVar1 = LookupBucketFor<unsigned_int>(this,Val,&local_18);
  if (bVar1) {
    pvVar2 = (pointer)((ulong)*(uint *)(this + 0x10) * 0x20 + *(long *)this);
  }
  else {
    local_18 = (pointer)((ulong)*(uint *)(this + 0x10) * 0x20 + *(long *)this);
    pvVar2 = local_18;
  }
  cVar3.End = pvVar2;
  cVar3.Ptr = local_18;
  return cVar3;
}

Assistant:

const_iterator find_as(const LookupKeyT &Val) const {
    const BucketT *TheBucket;
    if (LookupBucketFor(Val, TheBucket))
      return makeConstIterator(TheBucket, getBucketsEnd(), *this, true);
    return end();
  }